

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ogt_vox.h
# Opt level: O2

uint8_t * ogt_vox_write_scene(ogt_vox_scene *scene,uint32_t *buffer_size)

{
  uint8_t data;
  ogt_vox_model *poVar1;
  ogt_vox_group *poVar2;
  ogt_vox_instance *poVar3;
  ogt_vox_cam *poVar4;
  ogt_vox_layer *poVar5;
  int iVar6;
  uint32_t *puVar7;
  bool bVar8;
  uint uVar9;
  ulong uVar10;
  uchar *puVar11;
  uint32_t voxel_index;
  uint uVar12;
  ulong uVar13;
  uint32_t value;
  uint32_t group_index;
  uint uVar14;
  ulong uVar15;
  char *value_00;
  uint uVar16;
  ogt_vox_matl_array *poVar17;
  char *pcVar18;
  uint32_t x;
  uint uVar19;
  long lVar20;
  uint32_t child_group_index;
  uint32_t uVar21;
  ulong uVar22;
  _vox_file_writeable file;
  uint8_t local_520;
  uint8_t local_510;
  uint32_t chunk_size_2;
  uint32_t *local_500;
  ulong local_4f8;
  ulong local_4f0;
  size_t local_4e8;
  ulong local_4e0;
  char cam_fov [32];
  char cam_frustum [32];
  char cam_radius [32];
  char cam_angle [64];
  uint32_t chunk_size;
  undefined4 uStack_434;
  undefined8 uStack_430;
  undefined8 local_428;
  undefined8 uStack_420;
  undefined8 local_418;
  undefined8 uStack_410;
  undefined8 local_408;
  undefined8 uStack_400;
  
  file.data.data = (uchar *)0x0;
  file.data.capacity = 0;
  file.data.count = 0;
  local_500 = buffer_size;
  _vox_array<unsigned_char>::reserve(&file.data,0x400);
  _vox_file_write_uint32(&file,0x20584f56);
  _vox_file_write_uint32(&file,0x96);
  _vox_file_write_uint32(&file,0x4e49414d);
  _vox_file_write_uint32(&file,0);
  uVar14 = 0;
  _vox_file_write_uint32(&file,0);
  local_4e8 = file.data.count;
  local_4e0 = file.data.count & 0xffffffff;
  do {
    do {
      if (scene->num_models <= uVar14) {
        uVar14 = scene->num_groups;
        uVar13 = (ulong)uVar14;
        if (uVar13 == 0) {
          __assert_fail("(scene->num_groups > 0) && (\"no groups found in scene\")",
                        "/workspace/llm4binary/github/license_c_cmakelists/jpaver[P]opengametools/apps/../src/ogt_vox.h"
                        ,0x9a2,"uint8_t *ogt_vox_write_scene(const ogt_vox_scene *, uint32_t *)");
        }
        uVar16 = scene->num_instances;
        lVar20 = 0x58;
        for (uVar15 = 0; uVar15 < uVar13; uVar15 = uVar15 + 1) {
          poVar2 = scene->groups;
          _vox_file_write_chunk_nTRN
                    (&file,(uint32_t)uVar15,uVar14 + (uint32_t)uVar15,
                     *(char **)((long)poVar2 + lVar20 + -0x58),*(bool *)((long)poVar2 + lVar20 + -8)
                     ,(ogt_vox_transform *)((long)poVar2 + lVar20 + -0x50),
                     *(uint32_t *)((long)poVar2 + lVar20 + -0xc),
                     (ogt_vox_anim_transform *)((long)&poVar2->name + lVar20));
          uVar13 = (ulong)scene->num_groups;
          lVar20 = lVar20 + 0x68;
        }
        local_4f8 = (ulong)(uVar14 * 2);
        local_4f0 = (ulong)uVar16;
        for (uVar15 = 0; uVar15 < uVar13; uVar15 = uVar15 + 1) {
          uVar21 = 0;
          for (lVar20 = 0; uVar13 * 0x68 - lVar20 != 0; lVar20 = lVar20 + 0x68) {
            uVar21 = uVar21 + (uVar15 ==
                              *(uint *)((long)&scene->groups->parent_group_index + lVar20));
          }
          for (lVar20 = 0; (ulong)scene->num_instances * 0x78 - lVar20 != 0; lVar20 = lVar20 + 0x78)
          {
            uVar21 = uVar21 + (uVar15 == *(uint *)((long)&scene->instances->group_index + lVar20));
          }
          bVar8 = scene->groups[uVar15].hidden;
          pcVar18 = (char *)0x0;
          if (bVar8 != false) {
            pcVar18 = "1";
          }
          iVar6 = (int)file.data.count;
          _vox_file_write_uint32(&file,0x5052476e);
          _vox_file_write_uint32(&file,0);
          _vox_file_write_uint32(&file,0);
          _vox_file_write_uint32(&file,uVar14 + (int)uVar15);
          _vox_file_write_uint32(&file,(uint)bVar8);
          _vox_file_write_dict_key_value(&file,"_hidden",pcVar18);
          _vox_file_write_uint32(&file,uVar21);
          lVar20 = 0x48;
          for (uVar13 = 0; uVar13 < scene->num_groups; uVar13 = uVar13 + 1) {
            if (uVar15 == *(uint *)((long)&scene->groups->name + lVar20)) {
              _vox_file_write_uint32(&file,(uint32_t)uVar13);
            }
            lVar20 = lVar20 + 0x68;
          }
          lVar20 = 0x50;
          for (uVar13 = 0; uVar13 < scene->num_instances; uVar13 = uVar13 + 1) {
            if (uVar15 == *(uint *)((long)&scene->instances->name + lVar20)) {
              _vox_file_write_uint32(&file,uVar16 + uVar14 * 2 + (int)uVar13);
            }
            lVar20 = lVar20 + 0x78;
          }
          _chunk_size = CONCAT44(uStack_434,((int)file.data.count - iVar6) + -0xc);
          _vox_file_write_uint32_at_offset(&file,iVar6 + 4,&chunk_size);
          uVar13 = (ulong)scene->num_groups;
        }
        uVar13 = 0;
        while( true ) {
          uVar15 = local_4f0;
          uVar10 = (ulong)scene->num_instances;
          if (uVar10 <= uVar13) break;
          poVar3 = scene->instances;
          iVar6 = (int)file.data.count;
          _vox_file_write_uint32(&file,0x5048536e);
          _vox_file_write_uint32(&file,0);
          _vox_file_write_uint32(&file,0);
          _vox_file_write_uint32(&file,(int)local_4f8 + (int)uVar13);
          bVar8 = poVar3[uVar13].model_anim.loop;
          _vox_file_write_uint32(&file,(uint)bVar8);
          pcVar18 = (char *)0x0;
          if (bVar8 != false) {
            pcVar18 = "1";
          }
          _vox_file_write_dict_key_value(&file,"_loop",pcVar18);
          uVar21 = poVar3[uVar13].model_anim.num_keyframes;
          if (uVar21 == 0) {
            _vox_file_write_uint32(&file,1);
            _vox_file_write_uint32(&file,poVar3[uVar13].model_index);
            _vox_file_write_uint32(&file,0);
          }
          else {
            _vox_file_write_uint32(&file,uVar21);
            for (uVar15 = 0; uVar15 < poVar3[uVar13].model_anim.num_keyframes; uVar15 = uVar15 + 1)
            {
              _vox_file_write_uint32(&file,poVar3[uVar13].model_anim.keyframes[uVar15].model_index);
              _vox_file_write_uint32(&file,1);
              _vox_file_write_dict_key_value_uint32
                        (&file,(char *)(ulong)poVar3[uVar13].model_anim.keyframes[uVar15].
                                              frame_index,value);
            }
          }
          _chunk_size = CONCAT44(uStack_434,((int)file.data.count - iVar6) + -0xc);
          _vox_file_write_uint32_at_offset(&file,iVar6 + 4,&chunk_size);
          uVar13 = uVar13 + 1;
        }
        lVar20 = 0x58;
        uVar13 = local_4f8;
        for (uVar22 = 0; uVar22 < uVar10; uVar22 = uVar22 + 1) {
          poVar3 = scene->instances;
          uVar21 = (uint32_t)uVar13;
          _vox_file_write_chunk_nTRN
                    (&file,(int)uVar15 + uVar21,uVar21,*(char **)((long)poVar3 + lVar20 + -0x58),
                     *(bool *)((long)poVar3 + lVar20 + -4),
                     (ogt_vox_transform *)((long)poVar3 + lVar20 + -0x50),
                     *(uint32_t *)((long)poVar3 + lVar20 + -0xc),
                     (ogt_vox_anim_transform *)((long)&poVar3->name + lVar20));
          uVar10 = (ulong)scene->num_instances;
          lVar20 = lVar20 + 0x78;
          uVar13 = (ulong)(uVar21 + 1);
        }
        lVar20 = 0x28;
        for (uVar13 = 0; uVar13 < scene->num_cameras; uVar13 = uVar13 + 1) {
          poVar4 = scene->cameras;
          local_408 = 0;
          uStack_400 = 0;
          local_418 = 0;
          uStack_410 = 0;
          local_428 = 0;
          uStack_420 = 0;
          _chunk_size = 0;
          uStack_430 = 0;
          cam_angle[0x30] = '\0';
          cam_angle[0x31] = '\0';
          cam_angle[0x32] = '\0';
          cam_angle[0x33] = '\0';
          cam_angle[0x34] = '\0';
          cam_angle[0x35] = '\0';
          cam_angle[0x36] = '\0';
          cam_angle[0x37] = '\0';
          cam_angle[0x38] = '\0';
          cam_angle[0x39] = '\0';
          cam_angle[0x3a] = '\0';
          cam_angle[0x3b] = '\0';
          cam_angle[0x3c] = '\0';
          cam_angle[0x3d] = '\0';
          cam_angle[0x3e] = '\0';
          cam_angle[0x3f] = '\0';
          cam_angle[0x20] = '\0';
          cam_angle[0x21] = '\0';
          cam_angle[0x22] = '\0';
          cam_angle[0x23] = '\0';
          cam_angle[0x24] = '\0';
          cam_angle[0x25] = '\0';
          cam_angle[0x26] = '\0';
          cam_angle[0x27] = '\0';
          cam_angle[0x28] = '\0';
          cam_angle[0x29] = '\0';
          cam_angle[0x2a] = '\0';
          cam_angle[0x2b] = '\0';
          cam_angle[0x2c] = '\0';
          cam_angle[0x2d] = '\0';
          cam_angle[0x2e] = '\0';
          cam_angle[0x2f] = '\0';
          cam_angle[0x10] = '\0';
          cam_angle[0x11] = '\0';
          cam_angle[0x12] = '\0';
          cam_angle[0x13] = '\0';
          cam_angle[0x14] = '\0';
          cam_angle[0x15] = '\0';
          cam_angle[0x16] = '\0';
          cam_angle[0x17] = '\0';
          cam_angle[0x18] = '\0';
          cam_angle[0x19] = '\0';
          cam_angle[0x1a] = '\0';
          cam_angle[0x1b] = '\0';
          cam_angle[0x1c] = '\0';
          cam_angle[0x1d] = '\0';
          cam_angle[0x1e] = '\0';
          cam_angle[0x1f] = '\0';
          cam_angle[0] = '\0';
          cam_angle[1] = '\0';
          cam_angle[2] = '\0';
          cam_angle[3] = '\0';
          cam_angle[4] = '\0';
          cam_angle[5] = '\0';
          cam_angle[6] = '\0';
          cam_angle[7] = '\0';
          cam_angle[8] = '\0';
          cam_angle[9] = '\0';
          cam_angle[10] = '\0';
          cam_angle[0xb] = '\0';
          cam_angle[0xc] = '\0';
          cam_angle[0xd] = '\0';
          cam_angle[0xe] = '\0';
          cam_angle[0xf] = '\0';
          cam_radius[0x10] = '\0';
          cam_radius[0x11] = '\0';
          cam_radius[0x12] = '\0';
          cam_radius[0x13] = '\0';
          cam_radius[0x14] = '\0';
          cam_radius[0x15] = '\0';
          cam_radius[0x16] = '\0';
          cam_radius[0x17] = '\0';
          cam_radius[0x18] = '\0';
          cam_radius[0x19] = '\0';
          cam_radius[0x1a] = '\0';
          cam_radius[0x1b] = '\0';
          cam_radius[0x1c] = '\0';
          cam_radius[0x1d] = '\0';
          cam_radius[0x1e] = '\0';
          cam_radius[0x1f] = '\0';
          cam_radius[0] = '\0';
          cam_radius[1] = '\0';
          cam_radius[2] = '\0';
          cam_radius[3] = '\0';
          cam_radius[4] = '\0';
          cam_radius[5] = '\0';
          cam_radius[6] = '\0';
          cam_radius[7] = '\0';
          cam_radius[8] = '\0';
          cam_radius[9] = '\0';
          cam_radius[10] = '\0';
          cam_radius[0xb] = '\0';
          cam_radius[0xc] = '\0';
          cam_radius[0xd] = '\0';
          cam_radius[0xe] = '\0';
          cam_radius[0xf] = '\0';
          cam_frustum[0x10] = '\0';
          cam_frustum[0x11] = '\0';
          cam_frustum[0x12] = '\0';
          cam_frustum[0x13] = '\0';
          cam_frustum[0x14] = '\0';
          cam_frustum[0x15] = '\0';
          cam_frustum[0x16] = '\0';
          cam_frustum[0x17] = '\0';
          cam_frustum[0x18] = '\0';
          cam_frustum[0x19] = '\0';
          cam_frustum[0x1a] = '\0';
          cam_frustum[0x1b] = '\0';
          cam_frustum[0x1c] = '\0';
          cam_frustum[0x1d] = '\0';
          cam_frustum[0x1e] = '\0';
          cam_frustum[0x1f] = '\0';
          cam_frustum[0] = '\0';
          cam_frustum[1] = '\0';
          cam_frustum[2] = '\0';
          cam_frustum[3] = '\0';
          cam_frustum[4] = '\0';
          cam_frustum[5] = '\0';
          cam_frustum[6] = '\0';
          cam_frustum[7] = '\0';
          cam_frustum[8] = '\0';
          cam_frustum[9] = '\0';
          cam_frustum[10] = '\0';
          cam_frustum[0xb] = '\0';
          cam_frustum[0xc] = '\0';
          cam_frustum[0xd] = '\0';
          cam_frustum[0xe] = '\0';
          cam_frustum[0xf] = '\0';
          cam_fov[0x10] = '\0';
          cam_fov[0x11] = '\0';
          cam_fov[0x12] = '\0';
          cam_fov[0x13] = '\0';
          cam_fov[0x14] = '\0';
          cam_fov[0x15] = '\0';
          cam_fov[0x16] = '\0';
          cam_fov[0x17] = '\0';
          cam_fov[0x18] = '\0';
          cam_fov[0x19] = '\0';
          cam_fov[0x1a] = '\0';
          cam_fov[0x1b] = '\0';
          cam_fov[0x1c] = '\0';
          cam_fov[0x1d] = '\0';
          cam_fov[0x1e] = '\0';
          cam_fov[0x1f] = '\0';
          cam_fov[0] = '\0';
          cam_fov[1] = '\0';
          cam_fov[2] = '\0';
          cam_fov[3] = '\0';
          cam_fov[4] = '\0';
          cam_fov[5] = '\0';
          cam_fov[6] = '\0';
          cam_fov[7] = '\0';
          cam_fov[8] = '\0';
          cam_fov[9] = '\0';
          cam_fov[10] = '\0';
          cam_fov[0xb] = '\0';
          cam_fov[0xc] = '\0';
          cam_fov[0xd] = '\0';
          cam_fov[0xe] = '\0';
          cam_fov[0xf] = '\0';
          snprintf((char *)&chunk_size,0x40,"%.5f %.5f %.5f",
                   SUB84((double)*(float *)((long)poVar4->focus + lVar20 + -0x28),0),
                   (double)*(float *)((long)poVar4->focus + lVar20 + -0x24),
                   (double)*(float *)((long)poVar4->focus + lVar20 + -0x20));
          snprintf(cam_angle,0x40,"%.5f %.5f %.5f",
                   SUB84((double)*(float *)((long)poVar4->focus + lVar20 + -0x1c),0),
                   (double)*(float *)((long)poVar4->focus + lVar20 + -0x18),
                   (double)*(float *)((long)poVar4->focus + lVar20 + -0x14));
          snprintf(cam_radius,0x20,"%.5f",
                   SUB84((double)*(float *)((long)poVar4->focus + lVar20 + -0x10),0));
          snprintf(cam_frustum,0x20,"%.5f",
                   SUB84((double)*(float *)((long)poVar4->focus + lVar20 + -0xc),0));
          snprintf(cam_fov,0x20,"%i");
          uVar14 = *(int *)((long)poVar4->focus + lVar20 + -0x2c) - 1;
          pcVar18 = "pers";
          if (uVar14 < 4) {
            pcVar18 = &DAT_00114b14 + *(int *)(&DAT_00114b14 + (ulong)uVar14 * 4);
          }
          iVar6 = (int)file.data.count;
          _vox_file_write_uint32(&file,0x4d414372);
          _vox_file_write_uint32(&file,0);
          _vox_file_write_uint32(&file,0);
          _vox_file_write_uint32(&file,*(uint32_t *)((long)poVar4->focus + lVar20 + -0x30));
          _vox_file_write_uint32(&file,6);
          _vox_file_write_dict_key_value(&file,"_mode",pcVar18);
          _vox_file_write_dict_key_value(&file,"_focus",(char *)&chunk_size);
          _vox_file_write_dict_key_value(&file,"_angle",cam_angle);
          _vox_file_write_dict_key_value(&file,"_radius",cam_radius);
          _vox_file_write_dict_key_value(&file,"_frustum",cam_frustum);
          _vox_file_write_dict_key_value(&file,"_fov",cam_fov);
          chunk_size_2 = ((int)file.data.count - iVar6) - 0xc;
          _vox_file_write_uint32_at_offset(&file,iVar6 + 4,&chunk_size_2);
          lVar20 = lVar20 + 0x2c;
        }
        for (uVar13 = 1; uVar13 != 0x101; uVar13 = uVar13 + 1) {
          *(ogt_vox_rgba *)(cam_angle + uVar13 * 4 + 0x3c) = (scene->palette).color[uVar13 & 0xff];
        }
        _vox_file_write_uint32(&file,0x41424752);
        _vox_file_write_uint32(&file,0x400);
        _vox_file_write_uint32(&file,0);
        _vox_array<unsigned_char>::push_back_many(&file.data,(uchar *)&chunk_size,0x400);
        poVar17 = &scene->materials;
        for (lVar20 = 0; lVar20 != 0x100; lVar20 = lVar20 + 1) {
          uVar14 = poVar17->matl[0].content_flags;
          if (uVar14 != 0) {
            iVar6 = (int)file.data.count;
            _vox_file_write_uint32(&file,0x4c54414d);
            _vox_file_write_uint32(&file,0);
            _vox_file_write_uint32(&file,0);
            _vox_file_write_uint32(&file,(uint32_t)lVar20);
            _vox_file_write_uint32
                      (&file,(uVar14 >> 0xc & 1) +
                             (uVar14 >> 10 & 1) +
                             (uVar14 >> 8 & 1) +
                             (uVar14 >> 6 & 1) +
                             (uVar14 >> 4 & 1) +
                             (uVar14 >> 2 & 1) + (uVar14 & 1) + 1 + (uint)((uVar14 >> 1 & 1) != 0) +
                             (uint)((uVar14 >> 3 & 1) != 0) + (uint)((uVar14 >> 5 & 1) != 0) +
                             (uint)((uVar14 >> 7 & 1) != 0) + (uint)((uVar14 >> 9 & 1) != 0) +
                             (uint)((uVar14 >> 0xb & 1) != 0) + (uint)((uVar14 >> 0xd & 1) != 0));
            _vox_file_write_dict_key_value
                      (&file,"_type",
                       _ZZ19ogt_vox_write_scenePK13ogt_vox_scenePjE8type_str_rel +
                       *(int *)(_ZZ19ogt_vox_write_scenePK13ogt_vox_scenePjE8type_str_rel +
                               (ulong)poVar17->matl[0].type * 4));
            uVar14 = poVar17->matl[0].content_flags;
            if ((uVar14 & 1) != 0) {
              _vox_file_write_dict_key_value_float(&file,"_metal",poVar17->matl[0].metal);
              uVar14 = poVar17->matl[0].content_flags;
            }
            if ((uVar14 & 2) != 0) {
              _vox_file_write_dict_key_value_float(&file,"_rough",poVar17->matl[0].rough);
              uVar14 = poVar17->matl[0].content_flags;
            }
            if ((uVar14 & 4) != 0) {
              _vox_file_write_dict_key_value_float(&file,"_spec",poVar17->matl[0].spec);
              uVar14 = poVar17->matl[0].content_flags;
            }
            if ((uVar14 & 8) != 0) {
              _vox_file_write_dict_key_value_float(&file,"_ior",poVar17->matl[0].ior);
              uVar14 = poVar17->matl[0].content_flags;
            }
            if ((uVar14 & 0x10) != 0) {
              _vox_file_write_dict_key_value_float(&file,"_att",poVar17->matl[0].att);
              uVar14 = poVar17->matl[0].content_flags;
            }
            if ((uVar14 & 0x20) != 0) {
              _vox_file_write_dict_key_value_float(&file,"_flux",poVar17->matl[0].flux);
              uVar14 = poVar17->matl[0].content_flags;
            }
            if ((uVar14 & 0x40) != 0) {
              _vox_file_write_dict_key_value_float(&file,"_emit",poVar17->matl[0].emit);
              uVar14 = poVar17->matl[0].content_flags;
            }
            if ((char)uVar14 < '\0') {
              _vox_file_write_dict_key_value_float(&file,"_ldr",poVar17->matl[0].ldr);
              uVar14 = poVar17->matl[0].content_flags;
            }
            if ((uVar14 >> 8 & 1) != 0) {
              _vox_file_write_dict_key_value_float(&file,"_trans",poVar17->matl[0].trans);
              uVar14 = poVar17->matl[0].content_flags;
            }
            if ((uVar14 >> 9 & 1) != 0) {
              _vox_file_write_dict_key_value_float(&file,"_alpha",poVar17->matl[0].alpha);
              uVar14 = poVar17->matl[0].content_flags;
            }
            if ((uVar14 >> 10 & 1) != 0) {
              _vox_file_write_dict_key_value_float(&file,"_d",poVar17->matl[0].d);
              uVar14 = poVar17->matl[0].content_flags;
            }
            if ((uVar14 >> 0xb & 1) != 0) {
              _vox_file_write_dict_key_value_float(&file,"_sp",poVar17->matl[0].sp);
              uVar14 = poVar17->matl[0].content_flags;
            }
            if ((uVar14 >> 0xc & 1) != 0) {
              _vox_file_write_dict_key_value_float(&file,"_g",poVar17->matl[0].g);
              uVar14 = poVar17->matl[0].content_flags;
            }
            if ((uVar14 >> 0xd & 1) != 0) {
              _vox_file_write_dict_key_value_float(&file,"_media",poVar17->matl[0].media);
            }
            _chunk_size = CONCAT44(uStack_434,((int)file.data.count - iVar6) + -0xc);
            _vox_file_write_uint32_at_offset(&file,iVar6 + 4,&chunk_size);
          }
          poVar17 = (ogt_vox_matl_array *)(poVar17->matl + 1);
        }
        lVar20 = 0;
        for (uVar13 = 0; uVar15 = local_4e0, puVar7 = local_500, uVar13 < scene->num_layers;
            uVar13 = uVar13 + 1) {
          poVar5 = scene->layers;
          snprintf((char *)&chunk_size,0x40,"%u %u %u",(ulong)(&(poVar5->color).r)[lVar20],
                   (ulong)(&(poVar5->color).g)[lVar20],(ulong)(&(poVar5->color).b)[lVar20]);
          pcVar18 = *(char **)((long)&scene->layers->name + lVar20);
          bVar8 = (&scene->layers->hidden)[lVar20];
          value_00 = (char *)0x0;
          if (bVar8 != false) {
            value_00 = "1";
          }
          iVar6 = (int)file.data.count;
          _vox_file_write_uint32(&file,0x5259414c);
          _vox_file_write_uint32(&file,0);
          _vox_file_write_uint32(&file,0);
          _vox_file_write_uint32(&file,(uint32_t)uVar13);
          _vox_file_write_uint32(&file,((uint)bVar8 - (uint)(pcVar18 == (char *)0x0)) + 2);
          _vox_file_write_dict_key_value(&file,"_name",pcVar18);
          _vox_file_write_dict_key_value(&file,"_hidden",value_00);
          _vox_file_write_dict_key_value(&file,"_color",(char *)&chunk_size);
          _vox_file_write_uint32(&file,0xffffffff);
          cam_angle._0_4_ = ((int)file.data.count - iVar6) + -0xc;
          _vox_file_write_uint32_at_offset(&file,iVar6 + 4,(uint32_t *)cam_angle);
          lVar20 = lVar20 + 0x10;
        }
        if ((file.data.count >> 0x20 != 0) || (file.data.count - local_4e0 >> 0x20 != 0)) {
          __assert_fail("(0) && (\"Generated file size exceeded 4GiB, which is too large for Magicavoxel to parse.\")"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/jpaver[P]opengametools/apps/../src/ogt_vox.h"
                        ,0xabe,"uint8_t *ogt_vox_write_scene(const ogt_vox_scene *, uint32_t *)");
        }
        *local_500 = (uint32_t)file.data.count;
        puVar11 = _vox_array<unsigned_char>::operator[](&file.data,0);
        file.data.data = (uchar *)0x0;
        *(uint32_t *)(puVar11 + (uVar15 - 4)) = *puVar7 - (int)local_4e8;
        if (g_progress_callback_func != (ogt_vox_progress_callback_func)0x0) {
          (*g_progress_callback_func)(1.0,g_progress_callback_user_data);
        }
        goto LAB_001095ae;
      }
      poVar1 = scene->models[uVar14];
      if (((0x100 < poVar1->size_x) || (0x100 < poVar1->size_y)) || (0x100 < poVar1->size_z)) {
        __assert_fail("(model->size_x <= 256 && model->size_y <= 256 && model->size_z <= 256) && (\"model dimensions exceed the limit of 256x256x256\")"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/jpaver[P]opengametools/apps/../src/ogt_vox.h"
                      ,0x96d,"uint8_t *ogt_vox_write_scene(const ogt_vox_scene *, uint32_t *)");
      }
      uVar21 = 0;
      for (uVar13 = 0; poVar1->size_y * poVar1->size_x * poVar1->size_z != uVar13;
          uVar13 = uVar13 + 1) {
        uVar21 = (uVar21 + 1) - (uint)(poVar1->voxel_data[uVar13] == '\0');
      }
      _vox_file_write_uint32(&file,0x455a4953);
      _vox_file_write_uint32(&file,0xc);
      _vox_file_write_uint32(&file,0);
      if (((poVar1->size_x == 0) || (poVar1->size_y == 0)) || (poVar1->size_z == 0)) {
        __assert_fail("(model->size_x && model->size_y && model->size_z) && (\"model has zero size\")"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/jpaver[P]opengametools/apps/../src/ogt_vox.h"
                      ,0x97c,"uint8_t *ogt_vox_write_scene(const ogt_vox_scene *, uint32_t *)");
      }
      _vox_file_write_uint32(&file,poVar1->size_x);
      _vox_file_write_uint32(&file,poVar1->size_y);
      _vox_file_write_uint32(&file,poVar1->size_z);
      _vox_file_write_uint32(&file,0x495a5958);
      _vox_file_write_uint32(&file,uVar21 * 4 + 4);
      _vox_file_write_uint32(&file,0);
      _vox_file_write_uint32(&file,uVar21);
      uVar16 = 0;
      for (uVar9 = 0; uVar9 < poVar1->size_z; uVar9 = uVar9 + 1) {
        for (uVar12 = 0; uVar12 < poVar1->size_y; uVar12 = uVar12 + 1) {
          uVar19 = 0;
          while( true ) {
            if (poVar1->size_x <= uVar19) break;
            data = poVar1->voxel_data[uVar19 + uVar16];
            if (data != '\0') {
              _vox_file_write_uint8(&file,(uint8_t)uVar19);
              local_520 = (uint8_t)uVar12;
              _vox_file_write_uint8(&file,local_520);
              local_510 = (uint8_t)uVar9;
              _vox_file_write_uint8(&file,local_510);
              _vox_file_write_uint8(&file,data);
            }
            uVar19 = uVar19 + 1;
          }
          uVar16 = uVar19 + uVar16;
        }
      }
      uVar14 = uVar14 + 1;
    } while (g_progress_callback_func == (ogt_vox_progress_callback_func)0x0);
    bVar8 = (*g_progress_callback_func)
                      ((float)uVar14 / (float)(scene->num_models + 1),g_progress_callback_user_data)
    ;
  } while (bVar8);
  *local_500 = 0;
  puVar11 = (uchar *)0x0;
LAB_001095ae:
  _vox_array<unsigned_char>::~_vox_array(&file.data);
  return puVar11;
}

Assistant:

uint8_t* ogt_vox_write_scene(const ogt_vox_scene* scene, uint32_t* buffer_size) {
        _vox_file_writeable file;
        _vox_file_writeable_init(&file);
        _vox_file_writeable* fp = &file;

        // write file header and file version
        _vox_file_write_uint32(fp, CHUNK_ID_VOX_);
        _vox_file_write_uint32(fp, 150);

        // write the main chunk
        _vox_file_write_uint32(fp, CHUNK_ID_MAIN);
        _vox_file_write_uint32(fp, 0);
        _vox_file_write_uint32(fp, 0);  // this main_chunk_child_size will get patched up once everything is written.

        // we need to know how to patch up the main chunk size after we've written everything
        const uint32_t offset_post_main_chunk = _vox_file_get_offset(fp);

        // write out all model chunks
        for (uint32_t i = 0; i < scene->num_models; i++) {
            const ogt_vox_model* model = scene->models[i];
            ogt_assert(model->size_x <= 256 && model->size_y <= 256 && model->size_z <= 256, "model dimensions exceed the limit of 256x256x256");
            // count the number of solid voxels in the grid
            uint32_t num_voxels_in_grid = model->size_x * model->size_y * model->size_z;
            uint32_t num_solid_voxels = 0;
            for (uint32_t voxel_index = 0; voxel_index < num_voxels_in_grid; voxel_index++)
                if (model->voxel_data[voxel_index] != 0)
                    num_solid_voxels++;
            uint32_t chunk_size_xyzi = sizeof(uint32_t) + 4 * num_solid_voxels;

            // write the SIZE chunk header
            _vox_file_write_uint32(fp, CHUNK_ID_SIZE);
            _vox_file_write_uint32(fp, 12);
            _vox_file_write_uint32(fp, 0);

            // write the SIZE chunk payload
            ogt_assert(model->size_x && model->size_y && model->size_z, "model has zero size");
            _vox_file_write_uint32(fp, model->size_x);
            _vox_file_write_uint32(fp, model->size_y);
            _vox_file_write_uint32(fp, model->size_z);

            // write the XYZI chunk header
            _vox_file_write_uint32(fp, CHUNK_ID_XYZI);
            _vox_file_write_uint32(fp, chunk_size_xyzi);
            _vox_file_write_uint32(fp, 0);

            // write out XYZI chunk payload
            _vox_file_write_uint32(fp, num_solid_voxels);
            uint32_t voxel_index = 0;
            for (uint32_t z = 0; z < model->size_z; z++) {
                for (uint32_t y = 0; y < model->size_y; y++) {
                    for (uint32_t x = 0; x < model->size_x; x++, voxel_index++) {
                        uint8_t color_index = model->voxel_data[voxel_index];
                        if (color_index != 0) {
                            _vox_file_write_uint8(fp, (uint8_t)x);
                            _vox_file_write_uint8(fp, (uint8_t)y);
                            _vox_file_write_uint8(fp, (uint8_t)z);
                            _vox_file_write_uint8(fp, color_index);
                        }
                    }
                }
            }

            if (g_progress_callback_func) {
                // we indicate progress as number of models written, with an extra progress value for ending write
                if (!g_progress_callback_func((float)(i + 1)/(float)(scene->num_models + 1), g_progress_callback_user_data))
                {
                    *buffer_size = 0;
                    return NULL; // note: fp will be freed in dtor on exit
                }
            }
        }

        // define our node_id ranges.
        ogt_assert(scene->num_groups > 0, "no groups found in scene");
        uint32_t first_group_transform_node_id    = 0;
        uint32_t first_group_node_id              = first_group_transform_node_id + scene->num_groups;
        uint32_t first_shape_node_id              = first_group_node_id + scene->num_groups;
        uint32_t first_instance_transform_node_id = first_shape_node_id + scene->num_instances;

        // write the nTRN nodes for each of the groups in the scene.
        for (uint32_t group_index = 0; group_index < scene->num_groups; group_index++) {
            const ogt_vox_group* group = &scene->groups[group_index];
            _vox_file_write_chunk_nTRN(fp, first_group_transform_node_id + group_index, first_group_node_id + group_index, group->name, group->hidden, &group->transform, group->layer_index, &group->transform_anim);
        }
        // write the group nodes for each of the groups in the scene
        for (uint32_t group_index = 0; group_index < scene->num_groups; group_index++) {
            // count how many childnodes  there are. This is simply the sum of all
            // groups and instances that have this group as its parent
            uint32_t num_child_nodes = 0;
            for (uint32_t child_group_index = 0; child_group_index < scene->num_groups; child_group_index++)
                if (scene->groups[child_group_index].parent_group_index == group_index)
                    num_child_nodes++;
            for (uint32_t child_instance_index = 0; child_instance_index < scene->num_instances; child_instance_index++)
                if (scene->instances[child_instance_index].group_index == group_index)
                    num_child_nodes++;

            // count number of dictionary items
            const char* hidden_string = scene->groups[group_index].hidden ? "1" : NULL;
            uint32_t group_dict_keyvalue_count = (hidden_string ? 1 : 0);

            // compute the chunk size.
            uint32_t offset_of_chunk_header = _vox_file_get_offset(fp);

            // write the nGRP header
            _vox_file_write_uint32(fp, CHUNK_ID_nGRP);
            _vox_file_write_uint32(fp, 0); // chunk_size will get patched up after.
            _vox_file_write_uint32(fp, 0);
            // write the nGRP payload
            _vox_file_write_uint32(fp, first_group_node_id + group_index);       // node_id
            _vox_file_write_uint32(fp, group_dict_keyvalue_count); // num keyvalue pairs in node dictionary
            _vox_file_write_dict_key_value(fp, "_hidden", hidden_string);
            _vox_file_write_uint32(fp, num_child_nodes);
            // write the child group transform nodes
            for (uint32_t child_group_index = 0; child_group_index < scene->num_groups; child_group_index++)
                if (scene->groups[child_group_index].parent_group_index == group_index)
                    _vox_file_write_uint32(fp, first_group_transform_node_id + child_group_index);
            // write the child instance transform nodes
            for (uint32_t child_instance_index = 0; child_instance_index < scene->num_instances; child_instance_index++)
                if (scene->instances[child_instance_index].group_index == group_index)
                    _vox_file_write_uint32(fp, first_instance_transform_node_id + child_instance_index);

            uint32_t chunk_size = _vox_file_get_offset(fp) - offset_of_chunk_header - CHUNK_HEADER_LEN;
            _vox_file_write_uint32_at_offset(fp, offset_of_chunk_header + 4, &chunk_size);
        }

        // write out an nSHP chunk for each of the instances
        for (uint32_t i = 0; i < scene->num_instances; i++) {
            const ogt_vox_instance* instance = &scene->instances[i];

            uint32_t offset_of_chunk_header = _vox_file_get_offset(fp);
            // write the nSHP chunk header
            _vox_file_write_uint32(fp, CHUNK_ID_nSHP);
            _vox_file_write_uint32(fp, 0); // will get patched up at the end
            _vox_file_write_uint32(fp, 0);
            // write the nSHP chunk payload
            _vox_file_write_uint32(fp, first_shape_node_id + i);    // node_id

            // write the nSHP node dictionary
            const char* loop_string = instance->model_anim.loop ? "1" : NULL;
            uint32_t node_dict_keyvalue_count = (loop_string ? 1 : 0);
            _vox_file_write_uint32(fp, node_dict_keyvalue_count);  // num key values
            _vox_file_write_dict_key_value(fp, "_loop",   loop_string);

            if (instance->model_anim.num_keyframes == 0 ) {
                _vox_file_write_uint32(fp, 1);                      // num_models must be 1
                _vox_file_write_uint32(fp, instance->model_index);  // model_id
                _vox_file_write_uint32(fp, 0);                      // num keyvalue pairs in model dictionary
            }
            else {
                _vox_file_write_uint32(fp, instance->model_anim.num_keyframes);
                for (uint32_t j = 0; j < instance->model_anim.num_keyframes; j++) {
                    _vox_file_write_uint32(fp, instance->model_anim.keyframes[j].model_index); // model_id
                    _vox_file_write_uint32(fp, 1); // num keyvalue pairs in model dictionary
                    _vox_file_write_dict_key_value_uint32(fp, "_f", instance->model_anim.keyframes[j].frame_index);
                }
            }
            // compute and patch up the chunk size in the chunk header
            uint32_t chunk_size = _vox_file_get_offset(fp) - offset_of_chunk_header - CHUNK_HEADER_LEN;
            _vox_file_write_uint32_at_offset(fp, offset_of_chunk_header + 4, &chunk_size);
        }

        // write out a nTRN chunk for all instances - and make them point to the relevant nSHP chunk
        for (uint32_t i = 0; i < scene->num_instances; i++) {
            const ogt_vox_instance* instance = &scene->instances[i];
            uint32_t node_id       = first_instance_transform_node_id + i;
            uint32_t child_node_id = first_shape_node_id + i;
            _vox_file_write_chunk_nTRN(fp, node_id, child_node_id, instance->name, instance->hidden, &instance->transform, instance->layer_index, &instance->transform_anim);
        }

        // write out the rCAM chunks
        for (uint32_t i = 0; i < scene->num_cameras; i++) {
            const ogt_vox_cam* camera = &scene->cameras[i];
            char cam_focus[64] = "";
            char cam_angle[64] = "";
            char cam_radius[32] = "";
            char cam_frustum[32] = "";
            char cam_fov[32] = "";
            const char *cam_mode;
            _vox_sprintf(cam_focus, sizeof(cam_focus), "%.5f %.5f %.5f", camera->focus[0], camera->focus[1], camera->focus[2]);
            _vox_sprintf(cam_angle, sizeof(cam_angle), "%.5f %.5f %.5f", camera->angle[0], camera->angle[1], camera->angle[2]);
            _vox_sprintf(cam_radius, sizeof(cam_radius), "%.5f", camera->radius);
            _vox_sprintf(cam_frustum, sizeof(cam_frustum), "%.5f", camera->frustum);
            _vox_sprintf(cam_fov, sizeof(cam_fov), "%i", camera->fov);

            switch (camera->mode) {
            case ogt_cam_mode_free:
                cam_mode = "free";
                break;
            case ogt_cam_mode_pano:
                cam_mode = "pano";
                break;
            case ogt_cam_mode_isometric:
                cam_mode = "iso";
                break;
            case ogt_cam_mode_orthographic:
                cam_mode = "orth";
                break;
            default:
            case ogt_cam_mode_unknown:
            case ogt_cam_mode_perspective:
                cam_mode = "pers";
                break;
            }

            uint32_t offset_of_chunk_header = _vox_file_get_offset(fp);

            // write the rCAM header
            _vox_file_write_uint32(fp, CHUNK_ID_rCAM);
            _vox_file_write_uint32(fp, 0); // chunk_size will get patched up later
            _vox_file_write_uint32(fp, 0);

            _vox_file_write_uint32(fp, camera->camera_id);
            _vox_file_write_uint32(fp, 6);  // num key values
            _vox_file_write_dict_key_value(fp, "_mode", cam_mode);
            _vox_file_write_dict_key_value(fp, "_focus", cam_focus);
            _vox_file_write_dict_key_value(fp, "_angle", cam_angle);
            _vox_file_write_dict_key_value(fp, "_radius", cam_radius);
            _vox_file_write_dict_key_value(fp, "_frustum", cam_frustum);
            _vox_file_write_dict_key_value(fp, "_fov", cam_fov);

            // compute and patch up the chunk size in the chunk header
            uint32_t chunk_size = _vox_file_get_offset(fp) - offset_of_chunk_header - CHUNK_HEADER_LEN;
            _vox_file_write_uint32_at_offset(fp, offset_of_chunk_header + 4, &chunk_size);
        }

        // write out RGBA chunk for the palette
        {
            // .vox stores palette rotated by 1 color index, so do that now.
            ogt_vox_palette rotated_palette;
            for (uint32_t i = 0; i < 256; i++)
                rotated_palette.color[i] = scene->palette.color[(i + 1) & 255];

            // write the palette chunk header
            _vox_file_write_uint32(fp, CHUNK_ID_RGBA);
            _vox_file_write_uint32(fp, sizeof(ogt_vox_palette));
            _vox_file_write_uint32(fp, 0);
            // write the palette chunk payload
            _vox_file_write(fp, &rotated_palette, sizeof(ogt_vox_palette));
        }

        // write out MATL chunk
        {
            // keep in sync with ogt_matl_type
            static const char *type_str[] = {"_diffuse", "_metal", "_glass", "_emit", "_blend", "_media"};

            for (int32_t i = 0; i < 256; ++i) {
                const ogt_vox_matl &matl = scene->materials.matl[i];
                if (matl.content_flags == 0u) {
                    continue;
                }
                uint32_t matl_dict_keyvalue_count = 1;
                matl_dict_keyvalue_count += (matl.content_flags & k_ogt_vox_matl_have_metal) ? 1 : 0;
                matl_dict_keyvalue_count += (matl.content_flags & k_ogt_vox_matl_have_rough) ? 1 : 0;
                matl_dict_keyvalue_count += (matl.content_flags & k_ogt_vox_matl_have_spec)  ? 1 : 0;
                matl_dict_keyvalue_count += (matl.content_flags & k_ogt_vox_matl_have_ior)   ? 1 : 0;
                matl_dict_keyvalue_count += (matl.content_flags & k_ogt_vox_matl_have_att)   ? 1 : 0;
                matl_dict_keyvalue_count += (matl.content_flags & k_ogt_vox_matl_have_flux)  ? 1 : 0;
                matl_dict_keyvalue_count += (matl.content_flags & k_ogt_vox_matl_have_emit)  ? 1 : 0;
                matl_dict_keyvalue_count += (matl.content_flags & k_ogt_vox_matl_have_ldr)   ? 1 : 0;
                matl_dict_keyvalue_count += (matl.content_flags & k_ogt_vox_matl_have_trans) ? 1 : 0;
                matl_dict_keyvalue_count += (matl.content_flags & k_ogt_vox_matl_have_alpha) ? 1 : 0;
                matl_dict_keyvalue_count += (matl.content_flags & k_ogt_vox_matl_have_d)     ? 1 : 0;
                matl_dict_keyvalue_count += (matl.content_flags & k_ogt_vox_matl_have_sp)    ? 1 : 0;
                matl_dict_keyvalue_count += (matl.content_flags & k_ogt_vox_matl_have_g)     ? 1 : 0;
                matl_dict_keyvalue_count += (matl.content_flags & k_ogt_vox_matl_have_media) ? 1 : 0;

                uint32_t offset_of_chunk_header = _vox_file_get_offset(fp);

                // write the material chunk header
                _vox_file_write_uint32(fp, CHUNK_ID_MATL);
                _vox_file_write_uint32(fp, 0); // chunk_size will get patched up later
                _vox_file_write_uint32(fp, 0);

                _vox_file_write_uint32(fp, i); // material id
                _vox_file_write_uint32(fp, matl_dict_keyvalue_count);
                _vox_file_write_dict_key_value(fp, "_type", type_str[matl.type]);
                if (matl.content_flags & k_ogt_vox_matl_have_metal) {
                    _vox_file_write_dict_key_value_float(fp, "_metal", matl.metal);
                }
                if (matl.content_flags & k_ogt_vox_matl_have_rough) {
                    _vox_file_write_dict_key_value_float(fp, "_rough", matl.rough);
                }
                if (matl.content_flags & k_ogt_vox_matl_have_spec) {
                    _vox_file_write_dict_key_value_float(fp, "_spec", matl.spec);
                }
                if (matl.content_flags & k_ogt_vox_matl_have_ior) {
                    _vox_file_write_dict_key_value_float(fp, "_ior", matl.ior);
                }
                if (matl.content_flags & k_ogt_vox_matl_have_att) {
                    _vox_file_write_dict_key_value_float(fp, "_att", matl.att);
                }
                if (matl.content_flags & k_ogt_vox_matl_have_flux) {
                    _vox_file_write_dict_key_value_float(fp, "_flux", matl.flux);
                }
                if (matl.content_flags & k_ogt_vox_matl_have_emit) {
                    _vox_file_write_dict_key_value_float(fp, "_emit", matl.emit);
                }
                if (matl.content_flags & k_ogt_vox_matl_have_ldr) {
                    _vox_file_write_dict_key_value_float(fp, "_ldr", matl.ldr);
                }
                if (matl.content_flags & k_ogt_vox_matl_have_trans) {
                    _vox_file_write_dict_key_value_float(fp, "_trans", matl.trans);
                }
                if (matl.content_flags & k_ogt_vox_matl_have_alpha) {
                    _vox_file_write_dict_key_value_float(fp, "_alpha", matl.alpha);
                }
                if (matl.content_flags & k_ogt_vox_matl_have_d) {
                    _vox_file_write_dict_key_value_float(fp, "_d", matl.d);
                }
                if (matl.content_flags & k_ogt_vox_matl_have_sp) {
                    _vox_file_write_dict_key_value_float(fp, "_sp", matl.sp);
                }
                if (matl.content_flags & k_ogt_vox_matl_have_g) {
                    _vox_file_write_dict_key_value_float(fp, "_g", matl.g);
                }
                if (matl.content_flags & k_ogt_vox_matl_have_media) {
                    _vox_file_write_dict_key_value_float(fp, "_media", matl.media);
                }
                // compute and patch up the chunk size in the chunk header
                uint32_t chunk_size = _vox_file_get_offset(fp) - offset_of_chunk_header - CHUNK_HEADER_LEN;
                _vox_file_write_uint32_at_offset(fp, offset_of_chunk_header + 4, &chunk_size);
            }
        }

        // write all layer chunks out.
        for (uint32_t i = 0; i < scene->num_layers; i++) {
            char color_string[64];
            _vox_sprintf(color_string, sizeof(color_string), "%u %u %u", scene->layers[i].color.r, scene->layers[i].color.g, scene->layers[i].color.b);
            const char* layer_name_string = scene->layers[i].name;
            const char* hidden_string = scene->layers[i].hidden ? "1" : NULL;
            uint32_t layer_dict_keyvalue_count = 0;
            layer_dict_keyvalue_count += (layer_name_string ? 1 : 0);
            layer_dict_keyvalue_count += (hidden_string ? 1 : 0);
            layer_dict_keyvalue_count += 1; // color_string

            uint32_t offset_of_chunk_header = _vox_file_get_offset(fp);

            // write the layer chunk header
            _vox_file_write_uint32(fp, CHUNK_ID_LAYR);
            _vox_file_write_uint32(fp, 0); // chunk_size will get patched up later
            _vox_file_write_uint32(fp, 0);
            // write the layer chunk payload
            _vox_file_write_uint32(fp, i);                          // layer_id
            _vox_file_write_uint32(fp, layer_dict_keyvalue_count);  // num keyvalue pairs in layer dictionary
            _vox_file_write_dict_key_value(fp, "_name",   layer_name_string);
            _vox_file_write_dict_key_value(fp, "_hidden", hidden_string);
            _vox_file_write_dict_key_value(fp, "_color",  color_string);
            _vox_file_write_uint32(fp, UINT32_MAX);                 // reserved id

            // compute and patch up the chunk size in the chunk header
            uint32_t chunk_size = _vox_file_get_offset(fp) - offset_of_chunk_header - CHUNK_HEADER_LEN;
            _vox_file_write_uint32_at_offset(fp, offset_of_chunk_header + 4, &chunk_size);
        }

        // check that the buffer is not larger than the maximum file size, return nothing if would overflow
        if (fp->data.count > UINT32_MAX ||  (fp->data.count - offset_post_main_chunk) > UINT32_MAX)
        {
            ogt_assert(0, "Generated file size exceeded 4GiB, which is too large for Magicavoxel to parse.");
            *buffer_size = 0;
            return NULL;  // note: fp will be freed in dtor on exit
        }

        // we deliberately don't free the fp->data field, just pass the buffer pointer and size out to the caller
        *buffer_size = (uint32_t)fp->data.count;
        uint8_t* buffer_data = _vox_file_get_data(fp);
        // we deliberately clear this pointer so it doesn't get auto-freed on exiting. The caller will own the memory hereafter.
        fp->data.data = NULL;

        // patch up the main chunk's child chunk size now that we've written everything we're going to write.
        {
            uint32_t* main_chunk_child_size = (uint32_t*)& buffer_data[offset_post_main_chunk - sizeof(uint32_t)];
            *main_chunk_child_size = *buffer_size - offset_post_main_chunk;
        }

        if (g_progress_callback_func) {
            // we indicate progress as number of models written, with an extra progress value for ending write
            g_progress_callback_func(1.0f,g_progress_callback_user_data); // we ignore the return as exiting here anyway
        }

        return buffer_data;
    }